

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_warning.c
# Opt level: O0

void l2_parsing_warning(l2_parsing_warning_type warning_type,int lines,int cols,...)

{
  undefined8 uVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  char *escape_seq;
  va_list va;
  int cols_local;
  int lines_local;
  l2_parsing_warning_type warning_type_local;
  
  uVar1 = local_e0;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_f8;
  va[0]._0_8_ = &stack0x00000008;
  escape_seq._4_4_ = 0x30;
  escape_seq._0_4_ = 0x18;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (warning_type == L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE) {
    escape_seq._4_4_ = 0x30;
    escape_seq._0_4_ = 0x20;
    fprintf(_stderr,anon_var_dwarf_1f72,(ulong)(uint)lines,(ulong)(uint)cols,uVar1);
  }
  else {
    fprintf(_stderr,anon_var_dwarf_1f90);
  }
  return;
}

Assistant:

void l2_parsing_warning(l2_parsing_warning_type warning_type, int lines, int cols, ...) {
    va_list va;
    va_start(va, cols);

    char *escape_seq;

    switch (warning_type) {
        case L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE:
            escape_seq = va_arg(va, char *);
            fprintf(stderr, "L2 脚本解释警告 (在 %d 行 %d 列附近): 未知的转义序列 \'\\%s\', 它将被解释器当做普通字符\n", lines, cols, escape_seq);
            break;

        default:
            fprintf(stderr, "L2 脚本解释警告, 出现一个未知警告\n");
    }

    va_end(va);
}